

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

String * __thiscall
nigel::Token_Identifier::toString_abi_cxx11_
          (String *__return_storage_ptr__,Token_Identifier *this,bool extended)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->identifier)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

String Token_Identifier::toString( bool extended ) const
	{
		return identifier + ( extended ? "\t\tas identifier" : "" );
	}